

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusargument.h
# Opt level: O0

QDBusArgument * operator>>(QDBusArgument *arg,QList<QDBusMenuEvent> *list)

{
  byte bVar1;
  QDBusMenuEvent *in_RSI;
  QDBusArgument *in_RDI;
  long in_FS_OFFSET;
  QDBusMenuEvent item;
  QDBusMenuEvent *in_stack_ffffffffffffff98;
  undefined1 local_50 [72];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusArgument::beginArray();
  QList<QDBusMenuEvent>::clear((QList<QDBusMenuEvent> *)in_RSI);
  while( true ) {
    bVar1 = QDBusArgument::atEnd();
    if (((bVar1 ^ 0xff) & 1) == 0) break;
    memset(local_50,0xaa,0x48);
    QDBusMenuEvent::QDBusMenuEvent(in_RSI);
    operator>>((QDBusArgument *)in_RSI,in_stack_ffffffffffffff98);
    QList<QDBusMenuEvent>::push_back((QList<QDBusMenuEvent> *)in_RSI,in_stack_ffffffffffffff98);
    QDBusMenuEvent::~QDBusMenuEvent(in_RSI);
  }
  QDBusArgument::endArray();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline const QDBusArgument &operator>>(const QDBusArgument &arg, Container<T> &list)
{
    arg.beginArray();
    list.clear();
    while (!arg.atEnd()) {
        T item;
        arg >> item;
        list.push_back(item);
    }

    arg.endArray();
    return arg;
}